

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void __thiscall Client::_parseLine(Client *this,string *line)

{
  type this_00;
  string data;
  string command;
  allocator<char> local_38 [32];
  
  command._M_dataplus._M_p = (pointer)&command.field_2;
  command._M_string_length = 0;
  command.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&data,"",local_38);
  if (*(line->_M_dataplus)._M_p == '\\') {
    std::__cxx11::string::substr((ulong)local_38,(ulong)line);
    std::__cxx11::string::operator=((string *)&command,(string *)local_38);
    std::__cxx11::string::~string((string *)local_38);
    if (5 < line->_M_string_length) {
      std::__cxx11::string::substr((ulong)local_38,(ulong)line);
      std::__cxx11::string::operator=((string *)&data,(string *)local_38);
      std::__cxx11::string::~string((string *)local_38);
    }
  }
  else {
    std::__cxx11::string::assign((char *)&command);
    std::__cxx11::string::_M_assign((string *)&data);
  }
  this_00 = boost::shared_ptr<ServerConnection>::operator->(&this->m_server);
  ServerConnection::sendMessage(this_00,&command,&data);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::~string((string *)&command);
  return;
}

Assistant:

void _parseLine( const string& line ){
        string command;
        string data = "";
        if( line[0] == '\\' ){
            command = line.substr( 1, 4 );
            if( line.length() > 5 ){
                data = line.substr( 6 );
            }
        }
        else {
            command = "chat";
            data = line;
        }
        m_server->sendMessage( command, data );
    }